

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O3

ProgramData *
deqp::gles3::Performance::anon_unknown_1::defaultProgramData
          (ProgramData *__return_storage_ptr__,CaseShaderType shaderType,string *funcDefs,
          string *mainStatements)

{
  pointer pcVar1;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *this;
  long *plVar2;
  ProgramData *extraout_RAX;
  ProgramData *pPVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long lVar6;
  string fragPrec;
  string vtxPrec;
  allocator_type local_581;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  long *local_560 [2];
  long local_550 [2];
  long *local_540;
  long local_538;
  long local_530;
  long lStack_528;
  long *local_520;
  long local_518;
  long local_510;
  long lStack_508;
  long *local_500;
  long local_4f8;
  long local_4f0;
  long lStack_4e8;
  long *local_4e0 [2];
  long local_4d0 [2];
  long *local_4c0;
  long local_4b8;
  long local_4b0;
  long lStack_4a8;
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  long *local_480;
  long local_478;
  long local_470;
  long lStack_468;
  long *local_460;
  long local_458;
  long local_450;
  undefined4 uStack_448;
  undefined4 uStack_444;
  long *local_440;
  long local_438;
  long local_430;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  long local_3d0;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  long local_370;
  long lStack_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  long local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  long local_330;
  undefined4 uStack_328;
  undefined4 uStack_324;
  long *local_320;
  long local_318;
  long local_310;
  long lStack_308;
  long *local_300;
  long local_2f8;
  long local_2f0;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  long *local_2e0;
  long local_2d8;
  long local_2d0;
  long lStack_2c8;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  long *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *local_240;
  uint local_238;
  value_type local_230;
  uint local_210;
  value_type local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  Vec4 local_1a8;
  Vec4 local_198;
  Vec4 local_188;
  Vec4 local_178;
  AttribSpec local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100 [6];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_70;
  deUint32 local_58;
  undefined1 local_50 [24];
  bool local_38;
  
  local_420._0_8_ = local_420 + 0x10;
  local_420._16_4_ = 0x68676968;
  local_420._20_2_ = 0x70;
  local_420._8_8_ = 5;
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  local_580.field_2._M_allocated_capacity._0_4_ = 0x68676968;
  local_580.field_2._M_allocated_capacity._4_2_ = 0x70;
  local_580._M_string_length = 5;
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  stack0xffffffffffffffc1 = 0;
  std::operator+(&local_1c8,"#version 300 es\nin ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_2e0 = &local_2d0;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_2d0 = *plVar4;
    lStack_2c8 = plVar2[3];
  }
  else {
    local_2d0 = *plVar4;
    local_2e0 = (long *)*plVar2;
  }
  local_2d8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_2e0,local_420._0_8_);
  local_2c0 = &local_2b0;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_2b0 = *plVar4;
    lStack_2a8 = plVar2[3];
  }
  else {
    local_2b0 = *plVar4;
    local_2c0 = (long *)*plVar2;
  }
  local_2b8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_2a0 = &local_290;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_290 = *plVar4;
    lStack_288 = plVar2[3];
  }
  else {
    local_290 = *plVar4;
    local_2a0 = (long *)*plVar2;
  }
  local_298 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2a0,(ulong)local_580._M_dataplus._M_p);
  local_280 = &local_270;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_270 = *plVar4;
    lStack_268 = plVar2[3];
  }
  else {
    local_270 = *plVar4;
    local_280 = (long *)*plVar2;
  }
  local_278 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_280);
  local_3b0.field_2._M_allocated_capacity = (size_type)&local_390;
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar2 + 2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar2 == pbVar5) {
    local_390._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    local_390._M_string_length._0_4_ = (undefined4)plVar2[3];
    local_390._M_string_length._4_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_390._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    local_3b0.field_2._M_allocated_capacity =
         (size_type)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar2;
  }
  local_3b0.field_2._8_8_ = plVar2[1];
  *plVar2 = (long)pbVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_4e0[0] = local_4d0;
  if (shaderType == CASESHADERTYPE_VERTEX) {
    pcVar1 = (funcDefs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_4e0,pcVar1,pcVar1 + funcDefs->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,0x1aee929);
  }
  plVar2 = (long *)std::__cxx11::string::_M_append
                             (local_3b0.field_2._M_local_buf,(ulong)local_4e0[0]);
  local_4c0 = &local_4b0;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_4b0 = *plVar4;
    lStack_4a8 = plVar2[3];
  }
  else {
    local_4b0 = *plVar4;
    local_4c0 = (long *)*plVar2;
  }
  local_4b8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_4c0);
  local_4a0 = &local_490;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_490 = *plVar4;
    lStack_488 = plVar2[3];
  }
  else {
    local_490 = *plVar4;
    local_4a0 = (long *)*plVar2;
  }
  local_498 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_4a0,local_420._0_8_);
  local_480 = &local_470;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_470 = *plVar4;
    lStack_468 = plVar2[3];
  }
  else {
    local_470 = *plVar4;
    local_480 = (long *)*plVar2;
  }
  local_478 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_480);
  local_460 = &local_450;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_450 = *plVar4;
    uStack_448 = (undefined4)plVar2[3];
    uStack_444 = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_450 = *plVar4;
    local_460 = (long *)*plVar2;
  }
  local_458 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_3c0[0] = &local_3b0;
  if (shaderType == CASESHADERTYPE_VERTEX) {
    pcVar1 = (mainStatements->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3c0,pcVar1,pcVar1 + mainStatements->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,0x1aee929);
  }
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_3c0[0]);
  local_260 = &local_250;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_250 = *plVar4;
    lStack_248 = plVar2[3];
  }
  else {
    local_250 = *plVar4;
    local_260 = (long *)*plVar2;
  }
  local_258 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_260);
  local_440 = &local_430;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_430 = *plVar4;
    uStack_428 = (undefined4)plVar2[3];
    uStack_424 = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_430 = *plVar4;
    local_440 = (long *)*plVar2;
  }
  local_438 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_210 = 0;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_440,local_438 + (long)local_440);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100 + local_210,&local_208);
  std::operator+(&local_1e8,"#version 300 es\nlayout (location = 0) out ",&local_580);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_390.field_2._M_allocated_capacity = (size_type)&local_370;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_370 = *plVar4;
    lStack_368 = plVar2[3];
  }
  else {
    local_370 = *plVar4;
    local_390.field_2._M_allocated_capacity = (size_type)(long *)*plVar2;
  }
  local_390.field_2._8_8_ = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             (local_390.field_2._M_local_buf,(ulong)local_580._M_dataplus._M_p);
  local_360 = &local_350;
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar2 + 2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar2 == pbVar5) {
    local_350._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    local_350._M_string_length = plVar2[3];
  }
  else {
    local_350._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar2;
  }
  local_358 = plVar2[1];
  *plVar2 = (long)pbVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_360);
  local_3f0.field_2._M_allocated_capacity = (size_type)&local_3d0;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_3d0 = *plVar4;
    uStack_3c8 = (undefined4)plVar2[3];
    uStack_3c4 = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_3d0 = *plVar4;
    local_3f0.field_2._M_allocated_capacity = (size_type)(long *)*plVar2;
  }
  local_3f0.field_2._8_8_ = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_560[0] = local_550;
  if (shaderType == CASESHADERTYPE_FRAGMENT) {
    pcVar1 = (funcDefs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_560,pcVar1,pcVar1 + funcDefs->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_560,0x1aee929);
  }
  plVar2 = (long *)std::__cxx11::string::_M_append
                             (local_3f0.field_2._M_local_buf,(ulong)local_560[0]);
  local_540 = &local_530;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_530 = *plVar4;
    lStack_528 = plVar2[3];
  }
  else {
    local_530 = *plVar4;
    local_540 = (long *)*plVar2;
  }
  local_538 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_540);
  local_520 = &local_510;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_510 = *plVar4;
    lStack_508 = plVar2[3];
  }
  else {
    local_510 = *plVar4;
    local_520 = (long *)*plVar2;
  }
  local_518 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_520,(ulong)local_580._M_dataplus._M_p);
  local_500 = &local_4f0;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_4f0 = *plVar4;
    lStack_4e8 = plVar2[3];
  }
  else {
    local_4f0 = *plVar4;
    local_500 = (long *)*plVar2;
  }
  local_4f8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_500);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_330 = *plVar4;
    uStack_328 = (undefined4)plVar2[3];
    uStack_324 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_350.field_2._M_allocated_capacity = (size_type)&local_330;
  }
  else {
    local_330 = *plVar4;
    local_350.field_2._M_allocated_capacity = (size_type)(long *)*plVar2;
  }
  local_350.field_2._8_8_ = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_400[0] = &local_3f0;
  if (shaderType == CASESHADERTYPE_FRAGMENT) {
    pcVar1 = (mainStatements->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_400,pcVar1,pcVar1 + mainStatements->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_400,0x1aee929);
  }
  plVar2 = (long *)std::__cxx11::string::_M_append
                             (local_350.field_2._M_local_buf,(ulong)local_400[0]);
  local_320 = &local_310;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_310 = *plVar4;
    lStack_308 = plVar2[3];
  }
  else {
    local_310 = *plVar4;
    local_320 = (long *)*plVar2;
  }
  local_318 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_320);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_2f0 = *plVar4;
    uStack_2e8 = (undefined4)plVar2[3];
    uStack_2e4 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_300 = &local_2f0;
  }
  else {
    local_2f0 = *plVar4;
    local_300 = (long *)*plVar2;
  }
  local_2f8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_238 = 1;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_300,local_2f8 + (long)local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100 + local_238,&local_230);
  local_178.m_data[0] = 1.0;
  local_178.m_data[1] = 0.0;
  local_178.m_data[2] = 0.0;
  local_178.m_data[3] = 0.0;
  local_188.m_data[0] = 0.0;
  local_188.m_data[1] = 1.0;
  local_188.m_data[2] = 0.0;
  local_188.m_data[3] = 0.0;
  local_198.m_data[0] = 0.0;
  local_198.m_data[1] = 0.0;
  local_198.m_data[2] = 1.0;
  local_198.m_data[3] = 0.0;
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 0.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[3] = 1.0;
  deqp::gls::AttribSpec::AttribSpec
            (&local_160,"a_value",&local_178,&local_188,&local_198,&local_1a8);
  lVar6 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&(__return_storage_ptr__->sources).sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar6),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_100[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar6));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x90);
  local_240 = &vStack_70;
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&(__return_storage_ptr__->sources).attribLocationBindings,local_240);
  (__return_storage_ptr__->sources).transformFeedbackBufferMode = local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(__return_storage_ptr__->sources).transformFeedbackVaryings,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50);
  (__return_storage_ptr__->sources).separable = local_38;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::vector
            (&__return_storage_ptr__->attributes,1,&local_160,&local_581);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.name._M_dataplus._M_p != &local_160.name.field_2) {
    operator_delete(local_160.name._M_dataplus._M_p,local_160.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,local_310 + 1);
  }
  if (local_400[0] != &local_3f0) {
    operator_delete(local_400[0],(ulong)(local_3f0._M_dataplus._M_p + 1));
  }
  if ((long *)local_350.field_2._M_allocated_capacity != &local_330) {
    operator_delete((void *)local_350.field_2._M_allocated_capacity,local_330 + 1);
  }
  if (local_500 != &local_4f0) {
    operator_delete(local_500,local_4f0 + 1);
  }
  if (local_520 != &local_510) {
    operator_delete(local_520,local_510 + 1);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540,local_530 + 1);
  }
  if (local_560[0] != local_550) {
    operator_delete(local_560[0],local_550[0] + 1);
  }
  if ((long *)local_3f0.field_2._M_allocated_capacity != &local_3d0) {
    operator_delete((void *)local_3f0.field_2._M_allocated_capacity,local_3d0 + 1);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360,(ulong)(local_350._M_dataplus._M_p + 1));
  }
  if ((long *)local_390.field_2._M_allocated_capacity != &local_370) {
    operator_delete((void *)local_390.field_2._M_allocated_capacity,local_370 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440,local_430 + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_3c0[0] != &local_3b0) {
    operator_delete(local_3c0[0],(ulong)(local_3b0._M_dataplus._M_p + 1));
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480,local_470 + 1);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0,local_490 + 1);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0,local_4b0 + 1);
  }
  if (local_4e0[0] != local_4d0) {
    operator_delete(local_4e0[0],local_4d0[0] + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_3b0.field_2._M_allocated_capacity != &local_390) {
    operator_delete((void *)local_3b0.field_2._M_allocated_capacity,
                    (ulong)(local_390._M_dataplus._M_p + 1));
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,local_290 + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,local_2d0 + 1);
  }
  this = local_240;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (this);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,
                    CONCAT26(local_580.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_580.field_2._M_allocated_capacity._4_2_,
                                      local_580.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  pPVar3 = (ProgramData *)(local_420 + 0x10);
  if ((ProgramData *)local_420._0_8_ != pPVar3) {
    operator_delete((void *)local_420._0_8_,
                    CONCAT26(local_420._22_2_,CONCAT24(local_420._20_2_,local_420._16_4_)) + 1);
    pPVar3 = extraout_RAX;
  }
  return pPVar3;
}

Assistant:

static inline ProgramData defaultProgramData (CaseShaderType shaderType, const string& funcDefs, const string& mainStatements)
{
	const bool		isVertexCase	= shaderType == CASESHADERTYPE_VERTEX;
	const bool		isFragmentCase	= shaderType == CASESHADERTYPE_FRAGMENT;
	const string	vtxPrec			= getShaderPrecision(CASESHADERTYPE_VERTEX);
	const string	fragPrec		= getShaderPrecision(CASESHADERTYPE_FRAGMENT);

	return ProgramData(glu::ProgramSources() << glu::VertexSource(		"#version 300 es\n"
																		"in " + vtxPrec + " vec4 a_position;\n"
																		"in " + vtxPrec + " vec4 a_value;\n"
																		"out " + fragPrec + " vec4 v_value;\n"
																		+ (isVertexCase ? funcDefs : "") +
																		"void main (void)\n"
																		"{\n"
																		"	gl_Position = a_position;\n"
																		"	" + vtxPrec + " vec4 value = a_value;\n"
																		+ (isVertexCase ? mainStatements : "") +
																		"	v_value = value;\n"
																		"}\n")

											 << glu::FragmentSource(	"#version 300 es\n"
																		"layout (location = 0) out " + fragPrec + " vec4 o_color;\n"
																		"in " + fragPrec + " vec4 v_value;\n"
																		+ (isFragmentCase ? funcDefs : "") +
																		"void main (void)\n"
																		"{\n"
																		"	" + fragPrec + " vec4 value = v_value;\n"
																		+ (isFragmentCase ? mainStatements : "") +
																		"	o_color = value;\n"
																		"}\n"),
					  gls::AttribSpec("a_value",
									  Vec4(1.0f, 0.0f, 0.0f, 0.0f),
									  Vec4(0.0f, 1.0f, 0.0f, 0.0f),
									  Vec4(0.0f, 0.0f, 1.0f, 0.0f),
									  Vec4(0.0f, 0.0f, 0.0f, 1.0f)));
}